

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summarycalc.cpp
# Opt level: O0

void __thiscall summarycalc::outputstreamtype(summarycalc *this,int summary_set)

{
  int local_24;
  duration<long,_std::ratio<1L,_1000L>_> local_20;
  undefined4 local_18;
  int local_14;
  int streamtype;
  int summary_set_local;
  summarycalc *this_local;
  
  local_18 = 0x3000001;
  local_14 = summary_set;
  _streamtype = this;
  fwrite(&local_18,4,1,(FILE *)this->fout[summary_set]);
  this->offset_[local_14] = this->offset_[local_14] + 4;
  local_24 = 1000;
  std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_20,&local_24);
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(&local_20);
  return;
}

Assistant:

void summarycalc::outputstreamtype(int summary_set)
{
	int streamtype = summarycalc_id | 1;
	fwrite(&streamtype, sizeof(streamtype), 1, fout[summary_set]);
	offset_[summary_set] += sizeof(streamtype);
	std::this_thread::sleep_for(std::chrono::milliseconds(PIPE_DELAY));
}